

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

string * __thiscall
cmGeneratorExpressionEvaluationFile::FixRelativePath
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          string *relativePath,PathRole role,cmLocalGenerator *lg)

{
  PolicyStatus PVar1;
  string *psVar2;
  ostream *poVar3;
  PolicyID id;
  string local_1d0;
  string arg;
  ostringstream w;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  PVar1 = this->PolicyStatusCMP0070;
  if (PVar1 - NEW < 3) {
    if (role == PathForOutput) {
      psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
      cmsys::SystemTools::CollapseFullPath((string *)&w,relativePath,psVar2);
    }
    else {
      if (role != PathForInput) {
        return __return_storage_ptr__;
      }
      psVar2 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(lg);
      cmsys::SystemTools::CollapseFullPath((string *)&w,relativePath,psVar2);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&w);
    std::__cxx11::string::~string((string *)&w);
  }
  else {
    if (PVar1 != OLD) {
      if (PVar1 != WARN) {
        return __return_storage_ptr__;
      }
      arg._M_dataplus._M_p = (pointer)&arg.field_2;
      arg._M_string_length = 0;
      arg.field_2._M_local_buf[0] = '\0';
      if ((role == PathForOutput) || (role == PathForInput)) {
        std::__cxx11::string::assign((char *)&arg);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x46,id);
      poVar3 = std::operator<<((ostream *)&w,(string *)&local_1d0);
      poVar3 = std::operator<<(poVar3,"\nfile(GENERATE) given relative ");
      poVar3 = std::operator<<(poVar3,(string *)&arg);
      poVar3 = std::operator<<(poVar3," path:\n  ");
      poVar3 = std::operator<<(poVar3,(string *)relativePath);
      std::operator<<(poVar3,
                      "\nThis is not defined behavior unless CMP0070 is set to NEW.  For compatibility with older versions of CMake, the previous undefined behavior will be used."
                     );
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(lg,AUTHOR_WARNING,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
      std::__cxx11::string::~string((string *)&arg);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::FixRelativePath(
  std::string const& relativePath, PathRole role, cmLocalGenerator* lg)
{
  std::string resultPath;
  switch (this->PolicyStatusCMP0070) {
    case cmPolicies::WARN: {
      std::string arg;
      switch (role) {
        case PathForInput:
          arg = "INPUT";
          break;
        case PathForOutput:
          arg = "OUTPUT";
          break;
      }
      std::ostringstream w;
      /* clang-format off */
      w <<
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0070) << "\n"
        "file(GENERATE) given relative " << arg << " path:\n"
        "  " << relativePath << "\n"
        "This is not defined behavior unless CMP0070 is set to NEW.  "
        "For compatibility with older versions of CMake, the previous "
        "undefined behavior will be used."
        ;
      /* clang-format on */
      lg->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to use the relative path unchanged,
      // which ends up being used relative to the working dir.
      resultPath = relativePath;
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is to interpret the relative path with respect
      // to the current source or binary directory.
      switch (role) {
        case PathForInput:
          resultPath = cmSystemTools::CollapseFullPath(
            relativePath, lg->GetCurrentSourceDirectory());
          break;
        case PathForOutput:
          resultPath = cmSystemTools::CollapseFullPath(
            relativePath, lg->GetCurrentBinaryDirectory());
          break;
      }
      break;
  }
  return resultPath;
}